

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_sdot_idx_h_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  int32_t iVar9;
  uintptr_t opr_sz_00;
  uintptr_t max_sz;
  uint64_t d1;
  uint64_t d0;
  int16_t *m_indexed;
  int16_t *n;
  uint64_t *d;
  intptr_t index;
  intptr_t opr_sz_8;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  iVar9 = simd_data(desc);
  for (opr_sz = 0; opr_sz < (long)opr_sz_00 / 8; opr_sz = opr_sz + 2) {
    sVar1 = *(short *)((long)vn + opr_sz * 8 + 8);
    sVar2 = *(short *)((long)vm + opr_sz * 8 + (long)iVar9 * 8);
    sVar3 = *(short *)((long)vn + opr_sz * 8 + 10);
    sVar4 = *(short *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 2);
    sVar5 = *(short *)((long)vn + opr_sz * 8 + 0xc);
    sVar6 = *(short *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 4);
    sVar7 = *(short *)((long)vn + opr_sz * 8 + 0xe);
    sVar8 = *(short *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 6);
    *(long *)((long)vd + opr_sz * 8) =
         (long)*(short *)((long)vn + opr_sz * 8 + 6) *
         (long)*(short *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 6) +
         (long)*(short *)((long)vn + opr_sz * 8 + 4) *
         (long)*(short *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 4) +
         (long)*(short *)((long)vn + opr_sz * 8 + 2) *
         (long)*(short *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 2) +
         (long)*(short *)((long)vn + opr_sz * 8) *
         (long)*(short *)((long)vm + opr_sz * 8 + (long)iVar9 * 8) +
         *(long *)((long)vd + opr_sz * 8);
    *(long *)((long)vd + opr_sz * 8 + 8) =
         (long)sVar7 * (long)sVar8 +
         (long)sVar5 * (long)sVar6 + (long)sVar3 * (long)sVar4 + (long)sVar1 * (long)sVar2 +
         *(long *)((long)vd + opr_sz * 8 + 8);
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_sdot_idx_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc), opr_sz_8 = opr_sz / 8;
    intptr_t index = simd_data(desc);
    uint64_t *d = vd;
    int16_t *n = vn;
    int16_t *m_indexed = (int16_t *)vm + index * 4;

    /* This is supported by SVE only, so opr_sz is always a multiple of 16.
     * Process the entire segment all at once, writing back the results
     * only after we've consumed all of the inputs.
     */
    for (i = 0; i < opr_sz_8 ; i += 2) {
        uint64_t d0, d1;

        d0  = n[i * 4 + 0] * (int64_t)m_indexed[i * 4 + 0];
        d0 += n[i * 4 + 1] * (int64_t)m_indexed[i * 4 + 1];
        d0 += n[i * 4 + 2] * (int64_t)m_indexed[i * 4 + 2];
        d0 += n[i * 4 + 3] * (int64_t)m_indexed[i * 4 + 3];
        d1  = n[i * 4 + 4] * (int64_t)m_indexed[i * 4 + 0];
        d1 += n[i * 4 + 5] * (int64_t)m_indexed[i * 4 + 1];
        d1 += n[i * 4 + 6] * (int64_t)m_indexed[i * 4 + 2];
        d1 += n[i * 4 + 7] * (int64_t)m_indexed[i * 4 + 3];

        d[i + 0] += d0;
        d[i + 1] += d1;
    }

    clear_tail(d, opr_sz, simd_maxsz(desc));
}